

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
protozero::CopyablePtr<perfetto::protos::gen::PerfEvents_Tracepoint>::CopyablePtr
          (CopyablePtr<perfetto::protos::gen::PerfEvents_Tracepoint> *this,
          CopyablePtr<perfetto::protos::gen::PerfEvents_Tracepoint> *other)

{
  PerfEvents_Tracepoint *this_00;
  CopyablePtr<perfetto::protos::gen::PerfEvents_Tracepoint> *other_local;
  CopyablePtr<perfetto::protos::gen::PerfEvents_Tracepoint> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::PerfEvents_Tracepoint,_std::default_delete<perfetto::protos::gen::PerfEvents_Tracepoint>_>
  ::unique_ptr(&this->ptr_,&other->ptr_);
  this_00 = (PerfEvents_Tracepoint *)operator_new(0x70);
  perfetto::protos::gen::PerfEvents_Tracepoint::PerfEvents_Tracepoint(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::PerfEvents_Tracepoint,_std::default_delete<perfetto::protos::gen::PerfEvents_Tracepoint>_>
  ::reset(&other->ptr_,this_00);
  return;
}

Assistant:

CopyablePtr(CopyablePtr&& other) noexcept : ptr_(std::move(other.ptr_)) {
    other.ptr_.reset(new T());
  }